

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall
QPDFArgParser::getTopicHelp(QPDFArgParser *this,string *name,HelpTopic *ht,ostringstream *msg)

{
  size_type sVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  
  sVar1 = (ht->long_text)._M_string_length;
  if (sVar1 == 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)msg,(ht->short_text)._M_dataplus._M_p,
                        (ht->short_text)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)msg,(ht->long_text)._M_dataplus._M_p,sVar1);
  }
  if ((ht->options)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::ios::widen((char)*(undefined8 *)(*(long *)msg + -0x18) + (char)msg);
    std::ostream::put((char)msg);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Related options:",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    for (p_Var4 = (ht->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(ht->options)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)msg,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->option_help,(key_type *)(p_Var4 + 1));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(pmVar3->short_text)._M_dataplus._M_p,
                          (pmVar3->short_text)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::getTopicHelp(std::string const& name, HelpTopic const& ht, std::ostringstream& msg)
{
    if (ht.long_text.empty()) {
        msg << ht.short_text << std::endl;
    } else {
        msg << ht.long_text;
    }
    if (!ht.options.empty()) {
        msg << std::endl << "Related options:" << std::endl;
        for (auto const& i: ht.options) {
            msg << "  " << i << ": " << m->option_help[i].short_text << std::endl;
        }
    }
}